

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

uint xmlHashValue(uint seed,xmlChar *key,xmlChar *key2,xmlChar *key3,size_t *lengths)

{
  uint uVar1;
  uint uVar2;
  size_t local_40;
  size_t i;
  uint h2;
  uint h1;
  size_t *lengths_local;
  xmlChar *key3_local;
  xmlChar *key2_local;
  xmlChar *key_local;
  uint seed_local;
  
  i._4_4_ = seed ^ 0x3b00;
  i._0_4_ = seed << 0xf | seed >> 0x11;
  for (local_40 = 0; key[local_40] != '\0'; local_40 = local_40 + 1) {
    i._4_4_ = (key[local_40] + i._4_4_) * 9;
    i._0_4_ = ((i._4_4_ + (uint)i) * 0x80 | i._4_4_ + (uint)i >> 0x19) * 5;
  }
  if (lengths != (size_t *)0x0) {
    *lengths = local_40;
  }
  i._4_4_ = i._4_4_ * 9;
  i._0_4_ = ((i._4_4_ + (uint)i) * 0x80 | i._4_4_ + (uint)i >> 0x19) * 5;
  if (key2 != (xmlChar *)0x0) {
    for (local_40 = 0; key2[local_40] != '\0'; local_40 = local_40 + 1) {
      i._4_4_ = (key2[local_40] + i._4_4_) * 9;
      i._0_4_ = ((i._4_4_ + (uint)i) * 0x80 | i._4_4_ + (uint)i >> 0x19) * 5;
    }
    if (lengths != (size_t *)0x0) {
      lengths[1] = local_40;
    }
  }
  i._4_4_ = i._4_4_ * 9;
  i._0_4_ = ((i._4_4_ + (uint)i) * 0x80 | i._4_4_ + (uint)i >> 0x19) * 5;
  if (key3 != (xmlChar *)0x0) {
    for (local_40 = 0; key3[local_40] != '\0'; local_40 = local_40 + 1) {
      i._4_4_ = (key3[local_40] + i._4_4_) * 9;
      i._0_4_ = ((i._4_4_ + (uint)i) * 0x80 | i._4_4_ + (uint)i >> 0x19) * 5;
    }
    if (lengths != (size_t *)0x0) {
      lengths[2] = local_40;
    }
  }
  uVar1 = ((uint)i << 0xe | (uint)i >> 0x12) + ((uint)i ^ i._4_4_);
  uVar2 = (uVar1 >> 6 | uVar1 * 0x4000000) + (uVar1 ^ (uint)i);
  uVar1 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar2 ^ uVar1);
  return (uVar1 >> 8 | uVar1 * 0x1000000) + (uVar1 ^ uVar2);
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlHashValue(unsigned seed, const xmlChar *key, const xmlChar *key2,
             const xmlChar *key3, size_t *lengths) {
    unsigned h1, h2;
    size_t i;

    HASH_INIT(h1, h2, seed);

    for (i = 0; key[i] != 0; i++) {
        HASH_UPDATE(h1, h2, key[i]);
    }
    if (lengths)
        lengths[0] = i;

    HASH_UPDATE(h1, h2, 0);

    if (key2 != NULL) {
        for (i = 0; key2[i] != 0; i++) {
            HASH_UPDATE(h1, h2, key2[i]);
        }
        if (lengths)
            lengths[1] = i;
    }

    HASH_UPDATE(h1, h2, 0);

    if (key3 != NULL) {
        for (i = 0; key3[i] != 0; i++) {
            HASH_UPDATE(h1, h2, key3[i]);
        }
        if (lengths)
            lengths[2] = i;
    }

    HASH_FINISH(h1, h2);

    return(h2);
}